

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O1

void ssw_openerror(ssw_fileinternal_t *f,char *msg)

{
  FILE *__stream;
  
  if (f != (ssw_fileinternal_t *)0x0) {
    if ((f->filehandle).internal != (void *)0x0) {
      mcpl_generic_fclose(&f->filehandle);
    }
    (f->filehandle).internal = (void *)0x0;
    free(f->buf);
    free(f);
  }
  __stream = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    __stream = _stdout;
  }
  fprintf(__stream,"ERROR: %s\n",msg);
  exit(1);
}

Assistant:

void ssw_openerror(ssw_fileinternal_t * f, const char* msg) {
  if (f) {
    if ( f->filehandle.internal )
      mcpl_generic_fclose( &f->filehandle );
    f->filehandle.internal = NULL;
    free(f->buf);
    free(f);
  }
  ssw_error(msg);
}